

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

void Kit_TruthPrintProfile_int(uint *pTruth,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *pBytesInit;
  uint *pOut;
  uint *pOut_00;
  uint *pOut_01;
  uint *pOut_02;
  uint *pOut_03;
  uint *pOut_04;
  int (*paiVar6) [20];
  int iVar7;
  int (*paiVar8) [20];
  uint nVars_00;
  int iVar9;
  int (*paiVar10) [20];
  uint uVar11;
  int iVar12;
  size_t __size;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  uint *puVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong local_14d8;
  int Unique1 [20];
  int Mints1 [20];
  int Mints0 [20];
  int Mints [20];
  int Common2 [20] [20];
  int Unique2 [20] [20];
  int Total2 [20] [20];
  
  uVar21 = (ulong)(uint)nVars;
  iVar12 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    iVar12 = 1;
  }
  pBytesInit = (int *)malloc((long)(iVar12 * 4) << 2);
  __size = (long)iVar12 << 2;
  pOut = (uint *)malloc(__size);
  pOut_00 = (uint *)malloc(__size);
  pOut_01 = (uint *)malloc(__size);
  pOut_02 = (uint *)malloc(__size);
  pOut_03 = (uint *)malloc(__size);
  pOut_04 = (uint *)malloc(__size);
  if (0x14 < nVars) {
    __assert_fail("nVars <= 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x803,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
  }
  if (nVars < 6) {
    __assert_fail("nVars >= 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x804,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
  }
  iVar1 = Kit_TruthCountMinterms(pTruth,nVars,Mints,pBytesInit);
  for (uVar24 = 0; uVar21 != uVar24; uVar24 = uVar24 + 1) {
    iVar2 = Kit_TruthBooleanDiffCount(pTruth,nVars,(int)uVar24);
    Unique1[uVar24] = iVar2;
  }
  paiVar6 = Common2;
  paiVar8 = Unique2;
  paiVar10 = Total2;
  for (uVar24 = 0; uVar24 != uVar21; uVar24 = uVar24 + 1) {
    for (uVar16 = 0; uVar21 != uVar16; uVar16 = uVar16 + 1) {
      (*paiVar6)[uVar16] = -1;
      (*paiVar8)[uVar16] = -1;
      (*paiVar10)[uVar16] = -1;
    }
    paiVar6 = paiVar6 + 1;
    paiVar8 = paiVar8 + 1;
    paiVar10 = paiVar10 + 1;
  }
  iVar2 = 1 << ((char)nVars - 2U & 0x1f);
  nVars_00 = nVars - 1;
  uVar24 = 0;
  do {
    uVar11 = nVars_00;
    if ((int)nVars_00 < (int)(uint)uVar24) {
      uVar11 = (uint)uVar24;
    }
    if (uVar24 == uVar21) {
      putchar(10);
      printf(" V: ");
      iVar12 = 0;
      local_14d8 = uVar21;
      while (iVar1 = (int)local_14d8, local_14d8 = (ulong)(iVar1 - 1), iVar1 != 0) {
        printf("%8c  ",(ulong)(iVar12 + 0x61));
        iVar12 = iVar12 + 1;
      }
      putchar(10);
      printf(" M: ");
      for (uVar24 = 0; uVar21 != uVar24; uVar24 = uVar24 + 1) {
        printf("%8d  ",(ulong)(uint)Mints[uVar24]);
      }
      putchar(10);
      printf(" U: ");
      for (uVar24 = 0; uVar21 != uVar24; uVar24 = uVar24 + 1) {
        printf("%8d  ",(ulong)(uint)Unique1[uVar24]);
      }
      putchar(10);
      putchar(10);
      puts("Unique:");
      paiVar6 = Unique2;
      for (uVar24 = 0; uVar24 != uVar21; uVar24 = uVar24 + 1) {
        printf(" %2d ",uVar24 & 0xffffffff);
        for (uVar16 = 0; uVar21 != uVar16; uVar16 = uVar16 + 1) {
          printf("%8d  ",(ulong)(uint)(*paiVar6)[uVar16]);
        }
        putchar(10);
        paiVar6 = paiVar6 + 1;
      }
      puts("Common:");
      paiVar6 = Common2;
      for (uVar24 = 0; uVar24 != uVar21; uVar24 = uVar24 + 1) {
        printf(" %2d ",uVar24 & 0xffffffff);
        for (uVar16 = 0; uVar21 != uVar16; uVar16 = uVar16 + 1) {
          printf("%8d  ",(ulong)(uint)(*paiVar6)[uVar16]);
        }
        putchar(10);
        paiVar6 = paiVar6 + 1;
      }
      puts("Total:");
      paiVar6 = Total2;
      for (uVar24 = 0; uVar24 != uVar21; uVar24 = uVar24 + 1) {
        printf(" %2d ",uVar24 & 0xffffffff);
        for (uVar16 = 0; uVar21 != uVar16; uVar16 = uVar16 + 1) {
          printf("%8d  ",(ulong)(uint)(*paiVar6)[uVar16]);
        }
        putchar(10);
        paiVar6 = paiVar6 + 1;
      }
      free(pOut);
      free(pOut_00);
      free(pOut_01);
      free(pOut_02);
      free(pOut_03);
      free(pOut_04);
      free(pBytesInit);
      return;
    }
    Kit_TruthCopy(pOut,pTruth,nVars);
    puVar17 = pOut;
    uVar16 = uVar24;
    while (pOut = puVar17, uVar23 = (uint)uVar16, uVar11 != uVar23) {
      Kit_TruthSwapAdjacentVars(pOut_00,pOut,nVars,uVar23);
      puVar17 = pOut_00;
      pOut_00 = pOut;
      uVar16 = (ulong)(uVar23 + 1);
    }
    iVar3 = Kit_TruthCountMinterms(pOut,nVars_00,Mints0,pBytesInit);
    puVar17 = pOut + iVar12 / 2;
    iVar4 = Kit_TruthCountMinterms(puVar17,nVars_00,Mints1,pBytesInit);
    if (iVar1 != iVar4 + iVar3) {
      __assert_fail("nTotalMints == nTotalMints0 + nTotalMints1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                    ,0x820,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
    }
    uVar16 = 0;
    while (nVars_00 != uVar16) {
      uVar23 = (uint)(uVar16 + 1);
      uVar11 = uVar23;
      if (uVar16 < uVar24) {
        uVar11 = (uint)uVar16;
      }
      uVar22 = (ulong)uVar11;
      if (uVar24 == uVar22) {
        __assert_fail("v != iVar",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x830,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar7 = Mints0[uVar16];
      if ((iVar7 < 0) || (iVar2 < iVar7)) {
        __assert_fail("Cof00 >= 0 && Cof00 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x837,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar9 = iVar3 - iVar7;
      if ((iVar9 < 0) || (iVar2 < iVar9)) {
        __assert_fail("Cof01 >= 0 && Cof01 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x838,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar5 = Mints1[uVar16];
      if ((iVar5 < 0) || (iVar2 < iVar5)) {
        __assert_fail("Cof10 >= 0 && Cof10 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x839,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar13 = iVar4 - iVar5;
      if ((iVar13 < 0) || (iVar2 < iVar13)) {
        __assert_fail("Cof11 >= 0 && Cof11 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83a,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar18 = iVar2 - iVar7;
      if (iVar18 < 0) {
        __assert_fail("Coz00 >= 0 && Coz00 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83c,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar14 = iVar2 - iVar9;
      if (iVar14 < 0) {
        __assert_fail("Coz01 >= 0 && Coz01 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83d,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar19 = iVar2 - iVar5;
      if (iVar19 < 0) {
        __assert_fail("Coz10 >= 0 && Coz10 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83e,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar20 = iVar2 - iVar13;
      if (iVar20 < 0) {
        __assert_fail("Coz11 >= 0 && Coz11 <= nMints1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                      ,0x83f,"void Kit_TruthPrintProfile_int(unsigned int *, int)");
      }
      iVar15 = iVar14 * iVar5 + iVar19 * iVar9 + iVar13 * iVar18 + iVar20 * iVar7;
      Common2[uVar22][uVar24] = iVar15;
      Common2[uVar24][uVar22] = iVar15;
      iVar7 = (iVar5 + iVar9) * iVar18 + iVar20 * (iVar5 + iVar9) + iVar13 * (iVar19 + iVar14) +
              iVar15 + (iVar19 + iVar14) * iVar7;
      Total2[uVar22][uVar24] = iVar7;
      Total2[uVar24][uVar22] = iVar7;
      iVar7 = uVar23 - 1;
      Kit_TruthCofactor0New(pOut_01,pOut,nVars_00,iVar7);
      Kit_TruthCofactor1New(pOut_02,pOut,nVars_00,iVar7);
      Kit_TruthCofactor0New(pOut_03,puVar17,nVars_00,iVar7);
      Kit_TruthCofactor1New(pOut_04,puVar17,nVars_00,iVar7);
      iVar7 = Kit_TruthXorCount(pOut_01,pOut_02,nVars_00);
      iVar9 = Kit_TruthXorCount(pOut_01,pOut_03,nVars_00);
      iVar5 = Kit_TruthXorCount(pOut_01,pOut_04,nVars_00);
      iVar13 = Kit_TruthXorCount(pOut_02,pOut_03,nVars_00);
      iVar18 = Kit_TruthXorCount(pOut_02,pOut_04,nVars_00);
      iVar14 = Kit_TruthXorCount(pOut_03,pOut_04,nVars_00);
      iVar7 = iVar14 + iVar18 + iVar13 + iVar5 + iVar9 + iVar7;
      Unique2[uVar22][uVar24] = iVar7;
      Unique2[uVar24][uVar22] = iVar7;
      uVar16 = uVar16 + 1;
    }
    uVar24 = uVar24 + 1;
  } while( true );
}

Assistant:

void Kit_TruthPrintProfile_int( unsigned * pTruth, int nVars )
{
    int Mints[20];
    int Mints0[20];
    int Mints1[20];
    int Unique1[20];
    int Total2[20][20];
    int Unique2[20][20];
    int Common2[20][20];
    int nWords = Kit_TruthWordNum( nVars );
    int * pBytes    = ABC_ALLOC( int, nWords * 4 );
    unsigned * pIn  = ABC_ALLOC( unsigned, nWords );
    unsigned * pOut = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof00 = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof01 = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof10 = ABC_ALLOC( unsigned, nWords );
    unsigned * pCof11 = ABC_ALLOC( unsigned, nWords );
    unsigned * pTemp;
    int nTotalMints, nTotalMints0, nTotalMints1;
    int v, u, i, iVar, nMints1;
    int Cof00, Cof01, Cof10, Cof11;
    int Coz00, Coz01, Coz10, Coz11;
    assert( nVars <= 20 );
    assert( nVars >=  6 );

    nTotalMints = Kit_TruthCountMinterms( pTruth, nVars, Mints, pBytes );
    for ( v = 0; v < nVars; v++ )
        Unique1[v] = Kit_TruthBooleanDiffCount( pTruth, nVars, v );

    for ( v = 0; v < nVars; v++ )
    for ( u = 0; u < nVars; u++ )
        Total2[v][u] = Unique2[v][u] = Common2[v][u] = -1;

    nMints1 = (1<<(nVars-2));
    for ( v = 0; v < nVars; v++ )
    {
        // move this var to be the first
        Kit_TruthCopy( pIn, pTruth, nVars );
//        Extra_PrintBinary( stdout, pIn, (1<<nVars) ); printf( "\n" );
        for ( i = v; i < nVars - 1; i++ )
        {
            Kit_TruthSwapAdjacentVars( pOut, pIn, nVars, i );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
//        Extra_PrintBinary( stdout, pIn, (1<<nVars) ); printf( "\n" );
//        printf( "\n" );


        // count minterms in both cofactor
        nTotalMints0 = Kit_TruthCountMinterms( pIn,          nVars-1, Mints0, pBytes );
        nTotalMints1 = Kit_TruthCountMinterms( pIn+nWords/2, nVars-1, Mints1, pBytes );
        assert( nTotalMints == nTotalMints0 + nTotalMints1 );
/*
        for ( u = 0; u < nVars-1; u++ )
            printf( "%2d ", Mints0[u] );
        printf( "\n" );

        for ( u = 0; u < nVars-1; u++ )
            printf( "%2d ", Mints1[u] );
        printf( "\n" );
*/
        for ( u = 0; u < nVars-1; u++ )
        {
            if ( u < v )
                iVar = u;
            else 
                iVar = u + 1;
            assert( v != iVar );
            // get minter counts in the cofactors
            Cof00 =              Mints0[u]; Coz00 = nMints1 - Cof00;              
            Cof01 = nTotalMints0-Mints0[u]; Coz01 = nMints1 - Cof01;
            Cof10 =              Mints1[u]; Coz10 = nMints1 - Cof10;
            Cof11 = nTotalMints1-Mints1[u]; Coz11 = nMints1 - Cof11;

            assert( Cof00 >= 0 && Cof00 <= nMints1 );
            assert( Cof01 >= 0 && Cof01 <= nMints1 );
            assert( Cof10 >= 0 && Cof10 <= nMints1 );
            assert( Cof11 >= 0 && Cof11 <= nMints1 );

            assert( Coz00 >= 0 && Coz00 <= nMints1 );
            assert( Coz01 >= 0 && Coz01 <= nMints1 );
            assert( Coz10 >= 0 && Coz10 <= nMints1 );
            assert( Coz11 >= 0 && Coz11 <= nMints1 );

            Common2[v][iVar] = Common2[iVar][v] = Cof00 * Coz11 + Coz00 * Cof11 + Cof01 * Coz10 + Coz01 * Cof10;

            Total2[v][iVar] = Total2[iVar][v] = 
                Cof00 * Coz01 + Coz00 * Cof01 + 
                Cof00 * Coz10 + Coz00 * Cof10 + 
                Cof00 * Coz11 + Coz00 * Cof11 + 
                Cof01 * Coz10 + Coz01 * Cof10 + 
                Cof01 * Coz11 + Coz01 * Cof11 + 
                Cof10 * Coz11 + Coz10 * Cof11 ;

            
            Kit_TruthCofactor0New( pCof00, pIn,          nVars-1, u );
            Kit_TruthCofactor1New( pCof01, pIn,          nVars-1, u );
            Kit_TruthCofactor0New( pCof10, pIn+nWords/2, nVars-1, u );
            Kit_TruthCofactor1New( pCof11, pIn+nWords/2, nVars-1, u );

            Unique2[v][iVar] = Unique2[iVar][v] = 
                Kit_TruthXorCount( pCof00, pCof01, nVars-1 ) +
                Kit_TruthXorCount( pCof00, pCof10, nVars-1 ) +
                Kit_TruthXorCount( pCof00, pCof11, nVars-1 ) +
                Kit_TruthXorCount( pCof01, pCof10, nVars-1 ) +
                Kit_TruthXorCount( pCof01, pCof11, nVars-1 ) +
                Kit_TruthXorCount( pCof10, pCof11, nVars-1 );
        }
    }

    printf( "\n" );
    printf( " V: " );
    for ( v = 0; v < nVars; v++ )
        printf( "%8c  ", v+'a' );
    printf( "\n" );

    printf( " M: " );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Mints[v] );
    printf( "\n" );

    printf( " U: " );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Unique1[v] );
    printf( "\n" );
    printf( "\n" );

    printf( "Unique:\n" );
    for ( i = 0; i < nVars; i++ )
    {
    printf( " %2d ", i );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Unique2[i][v] );
    printf( "\n" );
    }

    printf( "Common:\n" );
    for ( i = 0; i < nVars; i++ )
    {
    printf( " %2d ", i );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Common2[i][v] );
    printf( "\n" );
    }

    printf( "Total:\n" );
    for ( i = 0; i < nVars; i++ )
    {
    printf( " %2d ", i );
    for ( v = 0; v < nVars; v++ )
        printf( "%8d  ", Total2[i][v] );
    printf( "\n" );
    }

    ABC_FREE( pIn );
    ABC_FREE( pOut );
    ABC_FREE( pCof00 );
    ABC_FREE( pCof01 );
    ABC_FREE( pCof10 );
    ABC_FREE( pCof11 );
    ABC_FREE( pBytes );
}